

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O0

bool r_exec::add(Context *context,uint16_t *index)

{
  byte bVar1;
  char cVar2;
  uint16_t uVar3;
  Atom *pAVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float local_20c;
  float local_164;
  Atom local_94 [4];
  Atom local_90 [4];
  Atom local_8c [4];
  Atom local_88 [4];
  Atom local_84 [4];
  Atom local_80 [4];
  undefined4 local_7c;
  Atom local_78 [4];
  Atom local_74 [4];
  Context local_70;
  undefined1 local_60 [8];
  Context rhs;
  Context local_40;
  undefined1 local_30 [8];
  Context lhs;
  uint16_t *index_local;
  Context *context_local;
  
  lhs.implementation = (_Context *)index;
  Context::getChild(&local_40,(uint16_t)context);
  Context::operator*((Context *)local_30);
  Context::~Context(&local_40);
  Context::getChild(&local_70,(uint16_t)context);
  Context::operator*((Context *)local_60);
  Context::~Context(&local_70);
  Context::operator[]((Context *)local_30,0);
  bVar1 = r_code::Atom::isFloat();
  if ((bVar1 & 1) == 0) {
    Context::operator[]((Context *)local_30,0);
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x39) {
      Context::operator[]((Context *)local_60,0);
      cVar2 = r_code::Atom::getDescriptor();
      if (cVar2 == -0x39) {
        pAVar4 = Context::operator[]((Context *)local_30,0);
        lVar5 = r_code::Utils::GetTimestamp(pAVar4);
        pAVar4 = Context::operator[]((Context *)local_60,0);
        lVar6 = r_code::Utils::GetTimestamp(pAVar4);
        uVar3 = Context::setTimestampResult(context,lVar5 + lVar6);
        *(uint16_t *)&(lhs.implementation)->_vptr__Context = uVar3;
        context_local._7_1_ = true;
        goto LAB_00282774;
      }
      Context::operator[]((Context *)local_60,0);
      bVar1 = r_code::Atom::isFloat();
      if ((bVar1 & 1) != 0) {
        pAVar4 = Context::operator[]((Context *)local_60,0);
        r_code::Atom::PlusInfinity();
        bVar1 = r_code::Atom::operator!=(pAVar4,local_90);
        r_code::Atom::~Atom(local_90);
        if ((bVar1 & 1) != 0) {
          pAVar4 = Context::operator[]((Context *)local_30,0);
          uVar7 = r_code::Utils::GetTimestamp(pAVar4);
          local_20c = (float)uVar7;
          Context::operator[]((Context *)local_60,0);
          fVar9 = (float)r_code::Atom::asFloat();
          uVar7 = (ulong)(local_20c + fVar9);
          uVar3 = Context::setTimestampResult
                            (context,uVar7 | (long)((local_20c + fVar9) - 9.223372e+18) &
                                             (long)uVar7 >> 0x3f);
          *(uint16_t *)&(lhs.implementation)->_vptr__Context = uVar3;
          context_local._7_1_ = true;
          goto LAB_00282774;
        }
      }
    }
  }
  else {
    Context::operator[]((Context *)local_60,0);
    bVar1 = r_code::Atom::isFloat();
    if ((bVar1 & 1) != 0) {
      pAVar4 = Context::operator[]((Context *)local_30,0);
      r_code::Atom::PlusInfinity();
      bVar1 = r_code::Atom::operator==(pAVar4,local_74);
      r_code::Atom::~Atom(local_74);
      if ((bVar1 & 1) == 0) {
        pAVar4 = Context::operator[]((Context *)local_60,0);
        r_code::Atom::PlusInfinity();
        bVar1 = r_code::Atom::operator==(pAVar4,local_80);
        r_code::Atom::~Atom(local_80);
        if ((bVar1 & 1) == 0) {
          Context::operator[]((Context *)local_30,0);
          fVar9 = (float)r_code::Atom::asFloat();
          Context::operator[]((Context *)local_60,0);
          fVar8 = (float)r_code::Atom::asFloat();
          r_code::Atom::Float(fVar9 + fVar8);
          uVar3 = Context::setAtomicResult(context,local_88);
          *(uint16_t *)&(lhs.implementation)->_vptr__Context = uVar3;
          r_code::Atom::~Atom(local_88);
          context_local._7_1_ = true;
        }
        else {
          r_code::Atom::PlusInfinity();
          uVar3 = Context::setAtomicResult(context,local_84);
          *(uint16_t *)&(lhs.implementation)->_vptr__Context = uVar3;
          r_code::Atom::~Atom(local_84);
          context_local._7_1_ = true;
        }
      }
      else {
        r_code::Atom::PlusInfinity();
        uVar3 = Context::setAtomicResult(context,local_78);
        *(uint16_t *)&(lhs.implementation)->_vptr__Context = uVar3;
        r_code::Atom::~Atom(local_78);
        context_local._7_1_ = true;
      }
      goto LAB_00282774;
    }
    Context::operator[]((Context *)local_60,0);
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x39) {
      pAVar4 = Context::operator[]((Context *)local_30,0);
      r_code::Atom::PlusInfinity();
      bVar1 = r_code::Atom::operator!=(pAVar4,local_8c);
      r_code::Atom::~Atom(local_8c);
      if ((bVar1 & 1) != 0) {
        pAVar4 = Context::operator[]((Context *)local_60,0);
        uVar7 = r_code::Utils::GetTimestamp(pAVar4);
        local_164 = (float)uVar7;
        Context::operator[]((Context *)local_30,0);
        fVar9 = (float)r_code::Atom::asFloat();
        uVar7 = (ulong)(local_164 + fVar9);
        uVar3 = Context::setTimestampResult
                          (context,uVar7 | (long)((local_164 + fVar9) - 9.223372e+18) &
                                           (long)uVar7 >> 0x3f);
        *(uint16_t *)&(lhs.implementation)->_vptr__Context = uVar3;
        context_local._7_1_ = true;
        goto LAB_00282774;
      }
    }
  }
  r_code::Atom::Nil();
  uVar3 = Context::setAtomicResult(context,local_94);
  *(uint16_t *)&(lhs.implementation)->_vptr__Context = uVar3;
  r_code::Atom::~Atom(local_94);
  context_local._7_1_ = false;
LAB_00282774:
  local_7c = 1;
  Context::~Context((Context *)local_60);
  Context::~Context((Context *)local_30);
  return context_local._7_1_;
}

Assistant:

bool add(const Context &context, uint16_t &index)
{
    Context lhs = *context.getChild(1);
    Context rhs = *context.getChild(2);

    if (lhs[0].isFloat()) {
        if (rhs[0].isFloat()) {
            if (lhs[0] == Atom::PlusInfinity()) {
                index = context.setAtomicResult(Atom::PlusInfinity());
                return true;
            }

            if (rhs[0] == Atom::PlusInfinity()) {
                index = context.setAtomicResult(Atom::PlusInfinity());
                return true;
            }

            index = context.setAtomicResult(Atom::Float(lhs[0].asFloat() + rhs[0].asFloat()));
            return true;
        } else if (rhs[0].getDescriptor() == Atom::TIMESTAMP) {
            if (lhs[0] != Atom::PlusInfinity()) {
                index = context.setTimestampResult(Utils::GetTimestamp(&rhs[0]) + lhs[0].asFloat());
                return true;
            }
        }
    } else if (lhs[0].getDescriptor() == Atom::TIMESTAMP) {
        if (rhs[0].getDescriptor() == Atom::TIMESTAMP) {
            index = context.setTimestampResult(Utils::GetTimestamp(&lhs[0]) + Utils::GetTimestamp(&rhs[0]));
            return true;
        } else if (rhs[0].isFloat()) {
            if (rhs[0] != Atom::PlusInfinity()) {
                index = context.setTimestampResult(Utils::GetTimestamp(&lhs[0]) + rhs[0].asFloat());
                return true;
            }
        }
    }

    index = context.setAtomicResult(Atom::Nil());
    return false;
}